

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inc_search_demo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  SquareCell sstate;
  SquareCell sstate_00;
  SquareCell gstate;
  SquareCell gstate_00;
  CalcHeuristicFunc_t<SquareCell,_double> calc_heuristic;
  GetNeighbourFunc_t<SquareCell,_double> get_neighbours;
  GetNeighbourFunc_t<SquareCell,_double> get_neighbours_00;
  ostream *poVar1;
  SquareCell *e;
  pointer pSVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> obstacle_ids;
  _Invoker_type p_Stack_1f0;
  code *pcVar3;
  undefined8 uVar4;
  code *pcVar5;
  code *pcVar6;
  Path<SquareCell> path2;
  Path<SquareCell> path;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> sgraph1;
  undefined1 local_d0 [32];
  _Function_base local_b0;
  GetSquareCellNeighbour find_neighbours;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> sgraph2;
  
  obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sgraph1._0_8_ = 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&obstacle_ids,(unsigned_long *)&sgraph1);
  sgraph1._0_8_ = 6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&obstacle_ids,(unsigned_long *)&sgraph1);
  sgraph1._0_8_ = 7;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&obstacle_ids,(unsigned_long *)&sgraph1);
  sgraph1._0_8_ = 0x11;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&obstacle_ids,(unsigned_long *)&sgraph1);
  sgraph1._0_8_ = 0x12;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&obstacle_ids,(unsigned_long *)&sgraph1);
  sgraph1._0_8_ = 0x13;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&obstacle_ids,(unsigned_long *)&sgraph1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,&obstacle_ids);
  find_neighbours.row_size_ = 5;
  find_neighbours.col_size_ = 5;
  find_neighbours.cell_size_ = 1.0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&find_neighbours.obstacle_ids_,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_128);
  sgraph1.vertex_map_._M_h._M_buckets = &sgraph1.vertex_map_._M_h._M_single_bucket;
  sgraph1.vertex_map_._M_h._M_bucket_count = 1;
  sgraph1.vertex_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  sgraph1.vertex_map_._M_h._M_element_count = 0;
  sgraph1.vertex_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  sgraph1.vertex_map_._M_h._M_rehash_policy._M_next_resize = 0;
  sgraph1.vertex_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar4 = (__buckets_ptr)0x0;
  pcVar3 = CalcHeuristic;
  pcVar6 = std::
           _Function_handler<double_(SquareCell,_SquareCell),_double_(*)(SquareCell,_SquareCell)>::
           _M_invoke;
  pcVar5 = std::
           _Function_handler<double_(SquareCell,_SquareCell),_double_(*)(SquareCell,_SquareCell)>::
           _M_manager;
  std::
  function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
  ::function<GetSquareCellNeighbour&,void>
            ((function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
              *)(local_d0 + 0x20),&find_neighbours);
  sstate.id = 0;
  sstate.idx.x = 0;
  sstate.idx.y = 0;
  gstate.idx.y = 4;
  gstate.idx.x = 4;
  gstate.id = 0x18;
  calc_heuristic.super__Function_base._M_functor._8_8_ =
       obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  calc_heuristic.super__Function_base._M_functor._M_unused._M_object =
       obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  calc_heuristic.super__Function_base._M_manager =
       (_Manager_type)
       obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  calc_heuristic._M_invoker = p_Stack_1f0;
  get_neighbours_00.super__Function_base._M_functor._8_8_ = uVar4;
  get_neighbours_00.super__Function_base._M_functor._M_unused._M_function_pointer = pcVar3;
  get_neighbours_00.super__Function_base._M_manager = pcVar5;
  get_neighbours_00._M_invoker = pcVar6;
  xmotion::AStar::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            (&path,(AStar *)&sgraph1,
             (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)
             &stack0xfffffffffffffe18,sstate,gstate,calc_heuristic,get_neighbours_00);
  std::_Function_base::~_Function_base((_Function_base *)(local_d0 + 0x20));
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe18);
  sgraph2.vertex_map_._M_h._M_buckets = &sgraph2.vertex_map_._M_h._M_single_bucket;
  sgraph2.vertex_map_._M_h._M_bucket_count = 1;
  sgraph2.vertex_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  sgraph2.vertex_map_._M_h._M_element_count = 0;
  sgraph2.vertex_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  sgraph2.vertex_map_._M_h._M_rehash_policy._M_next_resize = 0;
  sgraph2.vertex_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
  ::function<GetSquareCellNeighbour&,void>
            ((function<std::vector<std::tuple<SquareCell,double>,std::allocator<std::tuple<SquareCell,double>>>(SquareCell)>
              *)local_d0,&find_neighbours);
  sstate_00.id = 0;
  sstate_00.idx.x = 0;
  sstate_00.idx.y = 0;
  gstate_00.idx.y = 4;
  gstate_00.idx.x = 4;
  gstate_00.id = 0x18;
  get_neighbours.super__Function_base._M_functor._8_8_ =
       obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  get_neighbours.super__Function_base._M_functor._M_unused._M_object =
       obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  get_neighbours.super__Function_base._M_manager =
       (_Manager_type)
       obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  get_neighbours._M_invoker = (_Invoker_type)p_Stack_1f0;
  xmotion::Dijkstra::IncSearch<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>
            (&path2,(Dijkstra *)&sgraph2,
             (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)local_d0,sstate_00,
             gstate_00,get_neighbours);
  std::_Function_base::~_Function_base((_Function_base *)local_d0);
  poVar1 = std::operator<<((ostream *)&std::cout,"path a*: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (pSVar2 = path.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar2 != path.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"id: ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"path dijkstra: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (pSVar2 = path2.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar2 != path2.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>._M_impl.
                super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"id: ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::_Vector_base<SquareCell,_std::allocator<SquareCell>_>::~_Vector_base
            (&path2.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>);
  xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::~Graph(&sgraph2);
  std::_Vector_base<SquareCell,_std::allocator<SquareCell>_>::~_Vector_base
            (&path.super__Vector_base<SquareCell,_std::allocator<SquareCell>_>);
  xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::~Graph(&sgraph1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&find_neighbours.obstacle_ids_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&obstacle_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  SquareCell cell_s(0);
  cell_s.idx.x = 0;
  cell_s.idx.y = 0;

  SquareCell cell_g(24);
  cell_g.idx.x = 4;
  cell_g.idx.y = 4;

  std::vector<uint64_t> obstacle_ids;
  obstacle_ids.push_back(5);
  obstacle_ids.push_back(6);
  obstacle_ids.push_back(7);
  obstacle_ids.push_back(17);
  obstacle_ids.push_back(18);
  obstacle_ids.push_back(19);

  auto find_neighbours = GetSquareCellNeighbour(5, 5, 1.0, obstacle_ids);

  Graph<SquareCell, double> sgraph1;
  auto path = AStar::IncSearch(&sgraph1, cell_s, cell_g,
                               CalcHeuristicFunc_t<SquareCell>(CalcHeuristic),
                               GetNeighbourFunc_t<SquareCell>(find_neighbours));

  Graph<SquareCell, double> sgraph2;
  auto path2 =
      Dijkstra::IncSearch(&sgraph2, cell_s, cell_g,
                          GetNeighbourFunc_t<SquareCell>(find_neighbours));

  std::cout << "path a*: " << std::endl;
  for (auto &e : path) std::cout << "id: " << e.id << std::endl;
  std::cout << "path dijkstra: " << std::endl;
  for (auto &e : path2) std::cout << "id: " << e.id << std::endl;

  return 0;
}